

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

CAddr __thiscall
cppforth::Forth::virtualMemorySegmentInit(Forth *this,vmSegments segmentNum,Cell size)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  CAddr local_94;
  allocator<char> local_81;
  string local_80;
  allocator<unsigned_char> local_49;
  undefined1 local_48 [8];
  VirtualMemorySegment variables;
  Cell end;
  Cell start;
  Cell size_local;
  vmSegments segmentNum_local;
  Forth *this_local;
  
  sVar2 = std::
          vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
          ::size(&this->VirtualMemory);
  if (sVar2 == segmentNum) {
    variables.segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    variables.segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    sVar2 = std::
            vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
            ::size(&this->VirtualMemory);
    if (sVar2 == 0) {
      local_94 = 0;
    }
    else {
      pvVar3 = std::
               vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
               ::at(&this->VirtualMemory,(long)(int)(segmentNum - vmSegmentSourceBufferRefill));
      local_94 = pvVar3->end + 1;
    }
    variables.segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = local_94;
    local_48._4_4_ = local_94 + size;
    local_48._0_4_ = local_94;
    uVar1 = local_48._4_4_ - local_94;
    variables.segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = local_48._4_4_;
    std::allocator<unsigned_char>::allocator(&local_49);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&variables,(ulong)uVar1,
               &local_49);
    std::allocator<unsigned_char>::~allocator(&local_49);
    std::
    vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
    ::push_back(&this->VirtualMemory,(value_type *)local_48);
    this->VirtualMemoryFreeSegment =
         (Cell)variables.segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    this_local._4_4_ =
         variables.segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage._4_4_;
    VirtualMemorySegment::~VirtualMemorySegment((VirtualMemorySegment *)local_48);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"VirtualMemory init failure",&local_81);
    throwCppExceptionMessage(this,&local_80,errorAllocate);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

CAddr virtualMemorySegmentInit(vmSegments segmentNum, Cell size ){
			if (VirtualMemory.size() == segmentNum) {
				Cell start{},end{};
				start=(VirtualMemory.size()==0)?0:VirtualMemory.at(segmentNum-1).end+1;
				end=start+size;
				VirtualMemorySegment variables{ start, end, std::vector<Char>(end-start) };
				VirtualMemory.push_back(variables);
				VirtualMemoryFreeSegment = end;
				return start;
			} else {
				throwCppExceptionMessage("VirtualMemory init failure",errorAllocate);
			}
			assert("!Not reachable");
			return 0; // to avoid warning. this code in not reachable	
		}